

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

int * Gia_ManToResub(Gia_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  piVar3 = (int *)calloc((long)p->nObjs * 2,4);
  iVar2 = Gia_ManIsNormalized(p);
  if (iVar2 == 0) {
    __assert_fail("Gia_ManIsNormalized(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x1f5,"int *Gia_ManToResub(Gia_Man_t *)");
  }
  iVar2 = p->nObjs;
  if (1 < (long)iVar2) {
    pGVar4 = p->pObjs;
    iVar5 = 1;
    lVar6 = 0;
    do {
      pGVar4 = pGVar4 + 1;
      uVar1 = *(ulong *)pGVar4;
      uVar9 = (uint)uVar1;
      if ((~uVar9 & 0x9fffffff) != 0) {
        uVar8 = uVar9 & 0x1fffffff;
        if ((int)(iVar5 - uVar8) < 0) {
LAB_007add6e:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar10 = (uint)(uVar1 >> 0x1d) & 1;
        piVar3[lVar6 + 2] = (int)lVar6 + uVar10 + uVar8 * -2 + 2;
        if ((int)uVar9 < 0 && (uVar1 & 0x1fffffff) != 0x1fffffff) {
          iVar7 = uVar10 + (iVar5 - uVar8) * 2;
        }
        else {
          if (((int)uVar9 < 0) || ((int)(uVar1 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                          ,0x1ff,"int *Gia_ManToResub(Gia_Man_t *)");
          }
          uVar9 = (uint)(uVar1 >> 0x20) & 0x1fffffff;
          if ((int)(iVar5 - uVar9) < 0) goto LAB_007add6e;
          iVar7 = (int)lVar6 + (uint)((uVar1 >> 0x3d & 1) != 0) + uVar9 * -2 + 2;
        }
        piVar3[lVar6 + 3] = iVar7;
      }
      iVar5 = iVar5 + 1;
      lVar6 = lVar6 + 2;
    } while ((long)iVar2 * 2 + -2 != lVar6);
  }
  return piVar3;
}

Assistant:

int * Gia_ManToResub( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, * pObjs = ABC_CALLOC( int, 2*Gia_ManObjNum(p) );
    assert( Gia_ManIsNormalized(p) );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            continue;
        pObjs[2*i+0] = Gia_ObjFaninLit0(Gia_ManObj(p, i), i);
        if ( Gia_ObjIsCo(pObj) )
            pObjs[2*i+1] = pObjs[2*i+0];
        else if ( Gia_ObjIsAnd(pObj) )
            pObjs[2*i+1] = Gia_ObjFaninLit1(Gia_ManObj(p, i), i);
        else assert( 0 );
    }
    return pObjs;
}